

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPU.cpp
# Opt level: O3

void __thiscall PPU::incrementY(PPU *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  bool bVar4;
  
  uVar1 = this->vramCur;
  if ((~uVar1 & 0x7000) == 0) {
    bVar4 = (uVar1 & 0x3e0) != 0x3a0;
    uVar2 = uVar1 ^ 0x800;
    if (bVar4) {
      uVar2 = uVar1;
    }
    uVar3 = 0;
    if (bVar4) {
      uVar3 = uVar1 + 0x20 & 0x3e0;
    }
    uVar3 = uVar2 & 0x8c1f | uVar3;
  }
  else {
    uVar3 = uVar1 + 0x1000;
  }
  this->vramCur = uVar3;
  return;
}

Assistant:

void PPU::incrementY() {
    if ((vramCur & 0x7000) == 0x7000) {
        vramCur &= ~0x7000;
        int y = (vramCur & 0x03E0) >> 5;
        if (y == 29) {
            y = 0;
            vramCur ^= 0x0800;
        } else {
            y = (y + 1) & 31;
        }
        vramCur = (vramCur & ~0x03E0) | (y << 5);
    } else {
        vramCur += 0x1000;
    }
}